

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExprWriter.cpp
# Opt level: O0

void __thiscall ExprWriter::visit(ExprWriter *this,DoWhile *expr)

{
  ostream *poVar1;
  long in_RSI;
  long in_RDI;
  
  poVar1 = std::operator<<(*(ostream **)(in_RDI + 8),"do {");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  (**(code **)(**(long **)(in_RSI + 0x10) + 0x10))(*(long **)(in_RSI + 0x10),in_RDI);
  std::operator<<(*(ostream **)(in_RDI + 8),"} while (");
  (**(code **)(**(long **)(in_RSI + 0x18) + 0x10))(*(long **)(in_RSI + 0x18),in_RDI);
  poVar1 = std::operator<<(*(ostream **)(in_RDI + 8),");");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  return;
}

Assistant:

void ExprWriter::visit(DoWhile& expr) {
    ss << "do {" << std::endl;
    expr.body->accept(*this);
    ss << "} while (";
    expr.cond->accept(*this);
    ss << ");" << std::endl;
}